

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void sha3_256(void *key,int len,uint32_t seed,void *out)

{
  sha3_256_init(&ltc_state);
  ltc_state.whirlpool.state[0] = (ulong64)(seed ^ 1);
  sha3_process(&ltc_state,(uchar *)key,(long)len);
  sha3_done(&ltc_state,(uchar *)out);
  return;
}

Assistant:

inline void sha3_256(const void *key, int len, uint32_t seed, void *out)
{
  // objsize
  unsigned char buf[32];
  sha3_256_init(&ltc_state);
  ltc_state.sha3.s[0] = CONST64(1) ^ seed;
  sha3_process(&ltc_state, (unsigned char *)key, len);
  sha3_done(&ltc_state, (unsigned char *)out);
}